

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  unsigned_long_long uVar4;
  size_t sVar5;
  ZSTD_CCtx_params ZStack_b8;
  
  uVar4 = 0;
  if (params.fParams.contentSizeFlag != 0) {
    uVar4 = pss + 1;
  }
  zcs->streamStage = zcss_init;
  if (pss != 0) {
    uVar4 = pss + 1;
  }
  zcs->pledgedSrcSizePlusOne = uVar4;
  auVar1 = vpaddd_avx((undefined1  [16])params.cParams._0_16_,_DAT_001b5ab0);
  auVar2 = vpminud_avx(auVar1,_DAT_001b5ac0);
  auVar1 = vpcmpeqd_avx(auVar1,auVar2);
  sVar5 = 0xffffffffffffffd6;
  if (((((((auVar1 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
          (auVar1 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar1 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar1[0xf]) &&
       (params.cParams.minMatch - 3 < 5)) && (params.cParams.targetLength < 0x20001)) &&
     (params.cParams.strategy - ZSTD_fast < 9)) {
    ZSTD_assignParamsToCCtxParams(&ZStack_b8,&zcs->requestedParams,&params);
    memcpy(&zcs->requestedParams,&ZStack_b8,0x90);
    sVar3 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
    sVar5 = 0;
    if (0xffffffffffffff88 < sVar3) {
      sVar5 = sVar3;
    }
  }
  return sVar5;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) );
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) );
    zcs->requestedParams = ZSTD_assignParamsToCCtxParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) );
    return 0;
}